

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace::~IfcPolygonalBoundedHalfSpace
          (IfcPolygonalBoundedHalfSpace *this)

{
  ~IfcPolygonalBoundedHalfSpace
            ((IfcPolygonalBoundedHalfSpace *)
             ((long)&(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.
                     super_IfcRepresentationItem.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                     _vptr_ObjectHelper +
             (long)(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.
                   super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcPolygonalBoundedHalfSpace() : Object("IfcPolygonalBoundedHalfSpace") {}